

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::
Data<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>::
Data(Data<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
     *this,Data<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
           *other,size_t reserved)

{
  Entry *pEVar1;
  byte bVar2;
  ulong uVar3;
  Span *pSVar4;
  Entry *pEVar5;
  Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *pNVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  size_t numBuckets;
  R RVar11;
  Bucket BVar12;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  uVar3 = other->size;
  this->size = uVar3;
  this->numBuckets = 0;
  if (reserved < uVar3) {
    reserved = uVar3;
  }
  this->seed = other->seed;
  this->spans = (Span *)0x0;
  numBuckets = 0x80;
  if ((0x40 < reserved) && (numBuckets = 0xffffffffffffffff, reserved >> 0x3e == 0)) {
    lVar8 = 0x3f;
    if (reserved != 0) {
      for (; reserved >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar8 ^ 0x3f) & 0x3f);
  }
  this->numBuckets = numBuckets;
  RVar11 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar11.spans;
  uVar3 = other->numBuckets;
  if (0x7f < uVar3) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      pSVar4 = other->spans;
      lVar10 = 0;
      do {
        bVar2 = pSVar4->offsets[lVar10 + lVar8];
        if (bVar2 != 0xff) {
          pEVar5 = pSVar4[uVar9].entries;
          pEVar1 = pEVar5 + bVar2;
          uVar7 = *(ulong *)(pEVar1->storage).data;
          uVar7 = (uVar7 >> 0x20 ^ uVar7) * -0x2917014799a6026d;
          uVar7 = (uVar7 >> 0x20 ^ uVar7) * -0x2917014799a6026d;
          BVar12 = Data<QHashPrivate::Node<QHttp2Stream*,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>>
                   ::findBucketWithHash<QHttp2Stream*>
                             ((Data<QHashPrivate::Node<QHttp2Stream*,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>>
                               *)this,(QHttp2Stream **)(pEVar5 + bVar2),
                              uVar7 >> 0x20 ^ this->seed ^ uVar7);
          pNVar6 = Span<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
                   ::insert(BVar12.span,BVar12.index);
          pNVar6->key = *(QHttp2Stream **)(pEVar1->storage).data;
          QHttpNetworkRequest::QHttpNetworkRequest
                    (&(pNVar6->value).first,(QHttpNetworkRequest *)((pEVar1->storage).data + 8));
          (pNVar6->value).second = *(QHttpNetworkReply **)((pEVar1->storage).data + 0x18);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x80);
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x90;
    } while (uVar9 != uVar3 >> 7);
  }
  return;
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }